

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# echo.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_152f0d::EchoState::update
          (EchoState *this,ALCcontext *context,EffectSlot *slot,EffectProps *props,
          EffectTarget target)

{
  pointer paVar1;
  int iVar2;
  ulong uVar3;
  MixParams *mix;
  float fVar4;
  float fVar5;
  array<float,_16UL> coeffs1;
  array<float,_16UL> coeffs0;
  array<float,_16UL> local_a8;
  array<float,_16UL> local_68;
  
  mix = target.Main;
  fVar5 = (float)((context->mDevice).mPtr)->Frequency;
  iVar2 = (int)((props->Reverb).Density * fVar5 + 0.5);
  uVar3 = (ulong)(iVar2 + (uint)(iVar2 == 0));
  this->mTap[0].delay = uVar3;
  this->mTap[1].delay = (uint)(int)((props->Reverb).Diffusion * fVar5 + 0.5) + uVar3;
  fVar4 = 1.0 - (props->Reverb).Gain;
  if (fVar4 <= 0.0625) {
    fVar4 = 0.0625;
  }
  BiquadFilterR<float>::setParamsFromSlope(&this->mFilter,HighShelf,5000.0 / fVar5,fVar4,1.0);
  this->mFeedGain = (props->Reverb).GainHF;
  fVar4 = asinf((props->Reverb).DecayTime);
  CalcAngleCoeffs(&local_68,-fVar4,0.0,0.0);
  CalcAngleCoeffs(&local_a8,fVar4,0.0,0.0);
  paVar1 = (mix->Buffer).mDataEnd;
  (this->super_EffectState).mOutTarget.mData = (mix->Buffer).mData;
  (this->super_EffectState).mOutTarget.mDataEnd = paVar1;
  ComputePanGains(mix,local_68._M_elems,slot->Gain,(span<float,_16UL>)this->mGains[0].Target);
  ComputePanGains(mix,local_a8._M_elems,slot->Gain,(span<float,_16UL>)this->mGains[1].Target);
  return;
}

Assistant:

void EchoState::update(const ALCcontext *context, const EffectSlot *slot,
    const EffectProps *props, const EffectTarget target)
{
    const ALCdevice *device{context->mDevice.get()};
    const auto frequency = static_cast<float>(device->Frequency);

    mTap[0].delay = maxu(float2uint(props->Echo.Delay*frequency + 0.5f), 1);
    mTap[1].delay = float2uint(props->Echo.LRDelay*frequency + 0.5f) + mTap[0].delay;

    const float gainhf{maxf(1.0f - props->Echo.Damping, 0.0625f)}; /* Limit -24dB */
    mFilter.setParamsFromSlope(BiquadType::HighShelf, LOWPASSFREQREF/frequency, gainhf, 1.0f);

    mFeedGain = props->Echo.Feedback;

    /* Convert echo spread (where 0 = center, +/-1 = sides) to angle. */
    const float angle{std::asin(props->Echo.Spread)};

    const auto coeffs0 = CalcAngleCoeffs(-angle, 0.0f, 0.0f);
    const auto coeffs1 = CalcAngleCoeffs( angle, 0.0f, 0.0f);

    mOutTarget = target.Main->Buffer;
    ComputePanGains(target.Main, coeffs0.data(), slot->Gain, mGains[0].Target);
    ComputePanGains(target.Main, coeffs1.data(), slot->Gain, mGains[1].Target);
}